

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
sort_fn<std::less<void>>::operator()
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          sort_fn<std::less<void>> *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *c)

{
  pointer puVar1;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
            ((c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  puVar1 = (c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start =
       (c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = puVar1;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (c->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end(), compare);
        return c;
    }